

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O2

bool AString_replaceRangeAString(AString *str,size_t index,size_t count,AString *rep)

{
  bool bVar1;
  
  if (rep != (AString *)0x0) {
    bVar1 = AString_replaceRangeCString(str,index,count,rep->buffer,rep->size);
    return bVar1;
  }
  if (str != (AString *)0x0) {
    AString_remove(str,index,count);
    return true;
  }
  return false;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceRangeAString(struct AString *str, size_t index, size_t count, const struct AString *rep)
{
    if(rep == nullptr)
        return AString_replaceRangeCString(str, index, count, nullptr, 0);
    else
        return AString_replaceRangeCString(str, index, count, rep->buffer, rep->size);
}